

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_attribute_struct *
pugi::impl::anon_unknown_0::append_new_attribute(xml_node_struct *node,xml_allocator *alloc)

{
  ulong uVar1;
  size_t sVar2;
  xml_attribute_struct *pxVar3;
  xml_attribute_struct *pxVar4;
  xml_attribute_struct *pxVar5;
  xml_memory_page *local_10;
  
  sVar2 = alloc->_busy_size;
  uVar1 = sVar2 + 0x28;
  if (uVar1 < 0x7fd9) {
    local_10 = alloc->_root;
    alloc->_busy_size = uVar1;
    pxVar5 = (xml_attribute_struct *)((long)&local_10[1].allocator + sVar2);
  }
  else {
    pxVar5 = (xml_attribute_struct *)xml_allocator::allocate_memory_oob(alloc,0x28,&local_10);
    if (pxVar5 == (xml_attribute_struct *)0x0) {
      return (xml_attribute_struct *)0x0;
    }
  }
  pxVar5->name = (char_t *)0x0;
  pxVar5->value = (char_t *)0x0;
  pxVar5->prev_attribute_c = (xml_attribute_struct *)0x0;
  pxVar5->next_attribute = (xml_attribute_struct *)0x0;
  pxVar5->header = ((long)pxVar5 - (long)local_10) * 0x100;
  pxVar3 = node->first_attribute;
  if (pxVar3 == (xml_attribute_struct *)0x0) {
    node->first_attribute = pxVar5;
    pxVar3 = pxVar5;
  }
  else {
    pxVar4 = pxVar3->prev_attribute_c;
    pxVar4->next_attribute = pxVar5;
    pxVar5->prev_attribute_c = pxVar4;
  }
  pxVar3->prev_attribute_c = pxVar5;
  return pxVar5;
}

Assistant:

PUGI__FN_NO_INLINE xml_attribute_struct* append_new_attribute(xml_node_struct* node, xml_allocator& alloc)
	{
		if (!alloc.reserve()) return 0;

		xml_attribute_struct* attr = allocate_attribute(alloc);
		if (!attr) return 0;

		append_attribute(attr, node);

		return attr;
	}